

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::rasterization::anon_unknown_0::
BaseTestCase<vkt::rasterization::(anonymous_namespace)::TriangleFanTestInstance>::createInstance
          (BaseTestCase<vkt::rasterization::(anonymous_namespace)::TriangleFanTestInstance> *this,
          Context *context)

{
  BaseTriangleTestInstance *this_00;
  
  this_00 = (BaseTriangleTestInstance *)operator_new(0x290);
  BaseTriangleTestInstance::BaseTriangleTestInstance
            (this_00,context,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,
             (this->super_BaseRenderingTestCase).m_sampleCount);
  (this_00->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__BaseRenderingTestInstance_00bdc390;
  return (TestInstance *)this_00;
}

Assistant:

virtual TestInstance*	createInstance	(Context& context) const
							{
								return new ConcreteTestInstance(context, m_sampleCount);
							}